

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

void __thiscall nvim::Nvim::async_set_option(Nvim *this,string *name,Object *value)

{
  allocator local_41;
  string local_40;
  Object *local_20;
  Object *value_local;
  string *name_local;
  Nvim *this_local;
  
  local_20 = value;
  value_local = (Object *)name;
  name_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"nvim_set_option",&local_41);
  NvimRPC::
  async_call<std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            (&this->client_,&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local,
             local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void Nvim::async_set_option(const std::string& name, const Object& value) {
    client_.async_call("nvim_set_option", name, value);
}